

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Runtime::Runtime(Runtime *this)

{
  pair<const_char_*,_Jinx::Impl::SymbolType> pVar1;
  pair<const_char_*,_Jinx::Impl::SymbolType> local_70;
  char *local_60;
  char *symTypeText;
  SymbolType SStack_50;
  SymbolType symType;
  size_t i;
  StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>
  local_40;
  StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL> local_38;
  StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>
  local_30 [3];
  StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>
  local_18;
  Runtime *local_10;
  Runtime *this_local;
  
  local_10 = this;
  IRuntime::IRuntime(&this->super_IRuntime);
  std::enable_shared_from_this<Jinx::Impl::Runtime>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Jinx::Impl::Runtime>);
  (this->super_IRuntime)._vptr_IRuntime = (_func_int **)&PTR_Compile_003be708;
  StaticArena<4096UL,_16UL>::StaticArena(&this->m_staticArena);
  std::mutex::mutex(&this->m_libraryMutex);
  StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>
  ::StaticAllocator(&local_18,&this->m_staticArena);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
  ::map(&this->m_libraryMap,&local_18);
  std::mutex::mutex(&this->m_functionMutex);
  StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>
  ::StaticAllocator(local_30,&this->m_staticArena);
  std::
  map<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
  ::map(&this->m_functionMap,local_30);
  std::mutex::mutex(&this->m_propertyMutex);
  StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>::StaticAllocator
            (&local_38,&this->m_staticArena);
  std::
  map<unsigned_long,_Jinx::Variant,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
  ::map(&this->m_propertyMap,&local_38);
  std::mutex::mutex(&this->m_perfMutex);
  PerformanceStats::PerformanceStats(&this->m_perfStats);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_perfStartTime);
  StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>
  ::StaticAllocator(&local_40,&this->m_staticArena);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>_>
  ::map(&this->m_symbolTypeMap,&local_40);
  i = std::chrono::_V2::system_clock::now();
  (this->m_perfStartTime).__d.__r = i;
  for (_SStack_50 = 8; _SStack_50 < 0x44; _SStack_50 = _SStack_50 + 1) {
    symTypeText._4_4_ = SStack_50;
    local_60 = GetSymbolTypeText(SStack_50);
    pVar1 = std::make_pair<char_const*&,Jinx::Impl::SymbolType&>
                      (&local_60,(SymbolType *)((long)&symTypeText + 4));
    local_70.first = pVar1.first;
    local_70.second = pVar1.second;
    std::
    map<std::basic_string_view<char,std::char_traits<char>>,Jinx::Impl::SymbolType,std::less<std::basic_string_view<char,std::char_traits<char>>>,Jinx::StaticAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,Jinx::Impl::SymbolType>,4096ul,16ul>>
    ::insert<std::pair<char_const*,Jinx::Impl::SymbolType>>
              ((map<std::basic_string_view<char,std::char_traits<char>>,Jinx::Impl::SymbolType,std::less<std::basic_string_view<char,std::char_traits<char>>>,Jinx::StaticAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,Jinx::Impl::SymbolType>,4096ul,16ul>>
                *)&this->m_symbolTypeMap,&local_70);
  }
  return;
}

Assistant:

inline_t Runtime::Runtime()
	{
		m_perfStartTime = std::chrono::high_resolution_clock::now();

		// Build symbol type map, excluding symbols without a text representation
		for (size_t i = static_cast<size_t>(SymbolType::ForwardSlash); i < static_cast<size_t>(SymbolType::NumSymbols); ++i)
		{
			SymbolType symType = static_cast<SymbolType>(i);
			auto symTypeText = GetSymbolTypeText(symType);
			m_symbolTypeMap.insert(std::make_pair(symTypeText, symType));
		}
	}